

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O3

void __thiscall OpenMD::Integrator::postStep(Integrator *this)

{
  Snapshot *this_00;
  ProgressBar *this_01;
  RealType RVar1;
  double dVar2;
  RealType cq;
  
  if (this->needVelocityScaling == true) {
    RVar1 = Snapshot::getTime(this->snap);
    dVar2 = RVar1 - this->currThermal;
    if ((0.0 < dVar2) || (ABS(dVar2) <= this->dtEps)) {
      Velocitizer::randomize
                ((this->velocitizer_)._M_t.
                 super___uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_OpenMD::Velocitizer_*,_std::default_delete<OpenMD::Velocitizer>_>
                 .super__Head_base<0UL,_OpenMD::Velocitizer_*,_false>._M_head_impl,
                 this->targetScalingTemp);
      this->currThermal = this->thermalTime + this->currThermal;
    }
  }
  if (this->useRNEMD == true) {
    RVar1 = Snapshot::getTime(this->snap);
    dVar2 = RVar1 - this->currRNEMD;
    if ((0.0 < dVar2) || (ABS(dVar2) <= this->dtEps)) {
      RNEMD::RNEMD::doRNEMD
                ((this->rnemd_)._M_t.
                 super___uniq_ptr_impl<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_OpenMD::RNEMD::RNEMD_*,_std::default_delete<OpenMD::RNEMD::RNEMD>_>
                 .super__Head_base<0UL,_OpenMD::RNEMD::RNEMD_*,_false>._M_head_impl);
      this->currRNEMD = this->RNEMD_exchangeTime + this->currRNEMD;
    }
    RNEMD::RNEMD::collectData
              ((this->rnemd_)._M_t.
               super___uniq_ptr_impl<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_>
               ._M_t.
               super__Tuple_impl<0UL,_OpenMD::RNEMD::RNEMD_*,_std::default_delete<OpenMD::RNEMD::RNEMD>_>
               .super__Head_base<0UL,_OpenMD::RNEMD::RNEMD_*,_false>._M_head_impl);
    RNEMD::RNEMD::writeOutputFile
              ((this->rnemd_)._M_t.
               super___uniq_ptr_impl<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_>
               ._M_t.
               super__Tuple_impl<0UL,_OpenMD::RNEMD::RNEMD_*,_std::default_delete<OpenMD::RNEMD::RNEMD>_>
               .super__Head_base<0UL,_OpenMD::RNEMD::RNEMD_*,_false>._M_head_impl);
  }
  this_00 = this->snap;
  (*this->_vptr_Integrator[10])(this);
  Snapshot::setConservedQuantity(this_00,cq);
  RVar1 = Snapshot::getTime(this->snap);
  dVar2 = RVar1 - this->currSample;
  if ((0.0 < dVar2) || (ABS(dVar2) <= this->dtEps)) {
    DumpWriter::writeDumpAndEor(this->dumpWriter);
    this->currSample = this->sampleTime + this->currSample;
  }
  RVar1 = Snapshot::getTime(this->snap);
  dVar2 = RVar1 - this->currStatus;
  if ((0.0 < dVar2) || (ABS(dVar2) <= this->dtEps)) {
    Stats::collectStats(this->stats);
    StatWriter::writeStat(this->statWriter);
    this_01 = (this->progressBar)._M_t.
              super___uniq_ptr_impl<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>.
              _M_t.
              super__Tuple_impl<0UL,_OpenMD::ProgressBar_*,_std::default_delete<OpenMD::ProgressBar>_>
              .super__Head_base<0UL,_OpenMD::ProgressBar_*,_false>._M_head_impl;
    RVar1 = Snapshot::getTime(this->snap);
    ProgressBar::setStatus(this_01,RVar1,this->runTime);
    ProgressBar::update((this->progressBar)._M_t.
                        super___uniq_ptr_impl<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_OpenMD::ProgressBar_*,_std::default_delete<OpenMD::ProgressBar>_>
                        .super__Head_base<0UL,_OpenMD::ProgressBar_*,_false>._M_head_impl);
    this->needPotential = false;
    this->needVirial = false;
    this->currStatus = this->statusTime + this->currStatus;
  }
  RVar1 = Snapshot::getTime(this->snap);
  if (this->needReset == true) {
    dVar2 = RVar1 - this->currReset;
    if (dVar2 <= 0.0) {
      if (this->dtEps < ABS(dVar2)) goto LAB_001fed6a;
    }
    (*this->_vptr_Integrator[8])(this);
    this->currReset = this->resetTime + this->currReset;
  }
LAB_001fed6a:
  (*this->info_->sman_->_vptr_SnapshotManager[2])();
  Snapshot::increaseTime(this->snap,this->dt);
  return;
}

Assistant:

void Integrator::postStep() {
    RealType difference;

    if (needVelocityScaling) {
      difference = snap->getTime() - currThermal;

      if (difference > 0 || std::fabs(difference) <= dtEps) {
        velocitizer_->randomize(targetScalingTemp);
        currThermal += thermalTime;
      }
    }

    if (useRNEMD) {
      difference = snap->getTime() - currRNEMD;

      if (difference > 0 || std::fabs(difference) <= dtEps) {
        rnemd_->doRNEMD();
        currRNEMD += RNEMD_exchangeTime;
      }

      rnemd_->collectData();
      rnemd_->writeOutputFile();
    }

    saveConservedQuantity();

    difference = snap->getTime() - currSample;

    if (difference > 0 || std::fabs(difference) <= dtEps) {
      dumpWriter->writeDumpAndEor();
      currSample += sampleTime;
    }

    difference = snap->getTime() - currStatus;

    if (difference > 0 || std::fabs(difference) <= dtEps) {
      stats->collectStats();

      statWriter->writeStat();

      progressBar->setStatus(snap->getTime(), runTime);
      progressBar->update();

      needPotential = false;
      needVirial    = false;
      currStatus += statusTime;
    }

    difference = snap->getTime() - currReset;

    if (needReset && (difference > 0 || std::fabs(difference) <= dtEps)) {
      resetIntegrator();
      currReset += resetTime;
    }
    // save snapshot
    info_->getSnapshotManager()->advance();

    // increase time
    snap->increaseTime(dt);
  }